

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O2

bool __thiscall
sptk::GaussianMixtureModeling::Initialize
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  int *piVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  bool bVar7;
  ulong uVar8;
  double *pdVar9;
  ulong uVar10;
  int l_1;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint column;
  vector<double,_std::allocator<double>_> *vector;
  vector<double,_std::allocator<double>_> *data;
  ulong uVar15;
  int k;
  long lVar16;
  int l;
  vector<double,_std::allocator<double>_> mean;
  vector<int,_std::allocator<int>_> codebook_indices;
  vector<int,_std::allocator<int>_> num_data_in_cluster;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(mean_vectors);
  StatisticsAccumulation::StatisticsAccumulation
            ((StatisticsAccumulation *)&codebook_indices,this->num_order_,1,false,false);
  StatisticsAccumulation::Buffer::Buffer((Buffer *)&num_data_in_cluster);
  data = (input_vectors->
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = (input_vectors->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (data == pvVar6) {
      mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar7 = StatisticsAccumulation::GetMean
                        ((StatisticsAccumulation *)&codebook_indices,(Buffer *)&num_data_in_cluster,
                         &mean);
      if (bVar7) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(mean_vectors,&mean);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&mean.super__Vector_base<double,_std::allocator<double>_>);
        StatisticsAccumulation::Buffer::~Buffer((Buffer *)&num_data_in_cluster);
        num_data_in_cluster.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  (&codebook_indices,
                   ((long)(input_vectors->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(input_vectors->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x18,
                   (value_type_conflict2 *)&num_data_in_cluster,(allocator_type *)&mean);
        iVar14 = this->num_mixture_;
        if (1 < iVar14) {
          LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
                    ((LindeBuzoGrayAlgorithm *)&num_data_in_cluster,this->num_order_,1,iVar14,1,1000
                     ,1e-05,1e-05,1);
          bVar7 = LindeBuzoGrayAlgorithm::Run
                            ((LindeBuzoGrayAlgorithm *)&num_data_in_cluster,input_vectors,
                             mean_vectors,&codebook_indices,(double *)&mean);
          if (!bVar7) {
            bVar7 = false;
            goto LAB_00108af2;
          }
          iVar14 = this->num_mixture_;
        }
        uVar8 = ((long)(input_vectors->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(input_vectors->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18;
        std::vector<int,_std::allocator<int>_>::vector
                  (&num_data_in_cluster,(long)iVar14,(allocator_type *)&mean);
        uVar10 = 0;
        iVar14 = (int)uVar8;
        uVar12 = 0;
        if (0 < iVar14) {
          uVar12 = uVar8 & 0xffffffff;
        }
        for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
          piVar1 = (int *)(CONCAT44(num_data_in_cluster.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    num_data_in_cluster.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) +
                          (long)codebook_indices.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar10] * 4);
          *piVar1 = *piVar1 + 1;
        }
        std::vector<double,_std::allocator<double>_>::resize(weights,(long)this->num_mixture_);
        uVar10 = 0;
        uVar8 = (ulong)(uint)this->num_mixture_;
        if (this->num_mixture_ < 1) {
          uVar8 = uVar10;
        }
        for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar10] =
               (double)*(int *)(CONCAT44(num_data_in_cluster.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._4_4_,
                                         num_data_in_cluster.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start._0_4_) + uVar10 * 4) /
               (double)iVar14;
        }
        FloorWeight(this,weights);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::resize
                  (covariance_matrices,(long)this->num_mixture_);
        lVar13 = 0;
        for (lVar16 = 0; lVar16 < this->num_mixture_; lVar16 = lVar16 + 1) {
          SymmetricMatrix::Resize
                    ((SymmetricMatrix *)
                     ((long)&((covariance_matrices->
                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                     lVar13),this->num_order_ + 1);
          SymmetricMatrix::Fill
                    ((SymmetricMatrix *)
                     ((long)&((covariance_matrices->
                              super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                     lVar13),0.0);
          lVar13 = lVar13 + 0x40;
        }
        for (uVar8 = 0; uVar8 != uVar12; uVar8 = uVar8 + 1) {
          lVar13 = *(long *)&(input_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar8].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          iVar14 = codebook_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          lVar16 = *(long *)&(mean_vectors->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[iVar14].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          for (uVar10 = 0; (long)uVar10 <= (long)this->num_order_; uVar10 = uVar10 + 1) {
            dVar2 = *(double *)(lVar13 + uVar10 * 8);
            dVar3 = *(double *)(lVar16 + uVar10 * 8);
            uVar15 = uVar10 & 0xffffffff;
            if (this->is_diagonal_ == false) {
              uVar15 = 0;
            }
            for (; uVar15 <= uVar10; uVar15 = uVar15 + 1) {
              mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&PTR__Row_0011eac0;
              mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(mean.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     (int)uVar10);
              mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&this->mask_;
              pdVar9 = SymmetricMatrix::Row::operator[]((Row *)&mean,(int)uVar15);
              if ((*pdVar9 != 0.0) || (NAN(*pdVar9))) {
                dVar4 = *(double *)(lVar13 + uVar15 * 8);
                dVar5 = *(double *)(lVar16 + uVar15 * 8);
                mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((covariance_matrices->
                               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                               )._M_impl.super__Vector_impl_data._M_start + iVar14);
                mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__Row_0011eac0;
                mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(mean.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       (int)uVar10);
                pdVar9 = SymmetricMatrix::Row::operator[]((Row *)&mean,(int)uVar15);
                *pdVar9 = (dVar4 - dVar5) * (dVar2 - dVar3) + *pdVar9;
              }
            }
          }
        }
        for (lVar13 = 0; lVar13 < this->num_mixture_; lVar13 = lVar13 + 1) {
          for (uVar11 = 0; (int)uVar11 <= this->num_order_; uVar11 = uVar11 + 1) {
            column = 0;
            if (this->is_diagonal_ != false) {
              column = uVar11;
            }
            for (; column <= uVar11; column = column + 1) {
              mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&PTR__Row_0011eac0;
              mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(mean.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,uVar11)
              ;
              mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)&this->mask_;
              pdVar9 = SymmetricMatrix::Row::operator[]((Row *)&mean,column);
              if ((*pdVar9 != 0.0) || (NAN(*pdVar9))) {
                iVar14 = *(int *)(CONCAT44(num_data_in_cluster.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start._4_4_,
                                           num_data_in_cluster.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start._0_4_) + lVar13 * 4);
                mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((covariance_matrices->
                               super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar13);
                mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__Row_0011eac0;
                mean.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)CONCAT44(mean.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                       uVar11);
                pdVar9 = SymmetricMatrix::Row::operator[]((Row *)&mean,column);
                *pdVar9 = *pdVar9 / (double)iVar14;
              }
            }
          }
        }
        FloorVariance(this,covariance_matrices);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&num_data_in_cluster.super__Vector_base<int,_std::allocator<int>_>);
        bVar7 = true;
LAB_00108af2:
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&codebook_indices.super__Vector_base<int,_std::allocator<int>_>);
        return bVar7;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&mean.super__Vector_base<double,_std::allocator<double>_>);
      break;
    }
    bVar7 = StatisticsAccumulation::Run
                      ((StatisticsAccumulation *)&codebook_indices,data,
                       (Buffer *)&num_data_in_cluster);
    data = data + 1;
  } while (bVar7);
  StatisticsAccumulation::Buffer::~Buffer((Buffer *)&num_data_in_cluster);
  return false;
}

Assistant:

bool GaussianMixtureModeling::Initialize(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  // Initialize codebook.
  {
    mean_vectors->clear();
    StatisticsAccumulation statistics_accumulation(num_order_, 1);
    StatisticsAccumulation::Buffer buffer;

    for (const std::vector<double>& vector : input_vectors) {
      if (!statistics_accumulation.Run(vector, &buffer)) {
        return false;
      }
    }

    std::vector<double> mean;
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      return false;
    }
    mean_vectors->push_back(mean);
  }

  // Initialize mean vectors.
  std::vector<int> codebook_indices(input_vectors.size(), 0);
  if (2 <= num_mixture_) {
    const int num_iteration(1000);
    const double convergence_threshold(1e-5);
    const double splitting_factor(1e-5);
    const int seed(1);
    double distance;
    LindeBuzoGrayAlgorithm lbg(num_order_, 1, num_mixture_, 1, num_iteration,
                               convergence_threshold, splitting_factor, seed);
    if (!lbg.Run(input_vectors, mean_vectors, &codebook_indices, &distance)) {
      return false;
    }
  }

  // Count number of data for each cluster.
  const int num_data(static_cast<int>(input_vectors.size()));
  std::vector<int> num_data_in_cluster(num_mixture_);
  {
    const int* src(&(codebook_indices[0]));
    int* dst(&(num_data_in_cluster[0]));
    for (int t(0); t < num_data; ++t) {
      ++dst[src[t]];
    }
  }

  // Initialize weights.
  {
    weights->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*weights)[k] = static_cast<double>(num_data_in_cluster[k]) / num_data;
    }
    FloorWeight(weights);
  }

  // Initialize covariances.
  {
    covariance_matrices->resize(num_mixture_);
    for (int k(0); k < num_mixture_; ++k) {
      (*covariance_matrices)[k].Resize(num_order_ + 1);
      (*covariance_matrices)[k].Fill(0.0);
    }

    for (int t(0); t < num_data; ++t) {
      const double* x(&(input_vectors[t][0]));
      const int k(codebook_indices[t]);
      const double* mu(&((*mean_vectors)[k][0]));
      for (int l(0); l <= num_order_; ++l) {
        const double diff1(x[l] - mu[l]);
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            const double diff2(x[m] - mu[m]);
            (*covariance_matrices)[k][l][m] += diff1 * diff2;
          }
        }
      }
    }

    for (int k(0); k < num_mixture_; ++k) {
      for (int l(0); l <= num_order_; ++l) {
        for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
          if (0.0 != mask_[l][m]) {
            (*covariance_matrices)[k][l][m] /= num_data_in_cluster[k];
          }
        }
      }
    }
    FloorVariance(covariance_matrices);
  }

  return true;
}